

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_object.cxx
# Opt level: O1

void __thiscall xray_re::xr_object::save_skls(xr_object *this,xr_writer *w)

{
  pointer ppxVar1;
  pointer ppxVar2;
  undefined4 local_1c;
  
  local_1c = (undefined4)
             ((ulong)((long)(this->m_motions).
                            super__Vector_base<xray_re::xr_skl_motion_*,_std::allocator<xray_re::xr_skl_motion_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(this->m_motions).
                           super__Vector_base<xray_re::xr_skl_motion_*,_std::allocator<xray_re::xr_skl_motion_*>_>
                           ._M_impl.super__Vector_impl_data._M_start) >> 3);
  (*w->_vptr_xr_writer[2])(w,&local_1c,4);
  ppxVar1 = (this->m_motions).
            super__Vector_base<xray_re::xr_skl_motion_*,_std::allocator<xray_re::xr_skl_motion_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  for (ppxVar2 = (this->m_motions).
                 super__Vector_base<xray_re::xr_skl_motion_*,_std::allocator<xray_re::xr_skl_motion_*>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppxVar2 != ppxVar1;
      ppxVar2 = ppxVar2 + 1) {
    (*((*ppxVar2)->super_xr_motion)._vptr_xr_motion[3])(*ppxVar2,w);
  }
  return;
}

Assistant:

void xr_object::save_skls(xr_writer& w) const
{
	w.w_size_u32(m_motions.size());
	w.w_seq(m_motions, xr_writer::f_w_const<xr_skl_motion>(&xr_skl_motion::save));
}